

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::scrollToBottom(QAbstractItemView *this)

{
  long lVar1;
  int value;
  QScrollBar *this_00;
  QScrollBar *this_01;
  
  lVar1 = *(long *)(this + 8);
  if (*(char *)(lVar1 + 0x492) == '\x01') {
    if (*(int *)(lVar1 + 0x3a8) != 5) {
      QBasicTimer::stop();
      *(undefined1 *)(lVar1 + 0x492) = 0;
      (**(code **)(**(long **)(lVar1 + 8) + 0x220))();
    }
    (**(code **)(*(long *)this + 0x268))(this);
  }
  this_00 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
  this_01 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
  value = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
  QAbstractSlider::setValue(&this_00->super_QAbstractSlider,value);
  return;
}

Assistant:

void QAbstractItemView::scrollToBottom()
{
    Q_D(QAbstractItemView);
    if (d->delayedPendingLayout) {
        d->executePostedLayout();
        updateGeometries();
    }
    verticalScrollBar()->setValue(verticalScrollBar()->maximum());
}